

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O0

void __thiscall AmsRouter::AmsRouter(AmsRouter *this,AmsNetId netId)

{
  AmsRouter *this_local;
  AmsNetId netId_local;
  
  Router::Router(&this->super_Router);
  (this->super_Router)._vptr_Router = (_func_int **)&PTR__AmsRouter_001c8ae0;
  *(short *)((this->localAddr).b + 4) = netId.b._4_2_;
  *(int *)(this->localAddr).b = netId.b._0_4_;
  std::recursive_mutex::recursive_mutex(&this->mutex);
  std::_V2::condition_variable_any::condition_variable_any(&this->connection_attempt_events);
  std::
  map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  ::map(&this->connection_attempts);
  std::
  unordered_set<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_std::hash<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::equal_to<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>,_std::allocator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>_>_>
  ::unordered_set(&this->connections);
  std::
  map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
  ::map(&this->mapping);
  std::array<AmsPort,_128UL>::array(&this->ports);
  return;
}

Assistant:

AmsRouter::AmsRouter(AmsNetId netId)
    : localAddr(netId)
{}